

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall luna::ParseException::ParseException(ParseException *this,char *str,TokenDetail *t)

{
  long in_RDX;
  int *in_stack_00000140;
  TokenDetail *in_stack_00000148;
  int *in_stack_00000150;
  char *in_stack_00000158;
  char **in_stack_00000160;
  Exception *in_stack_00000168;
  char (*in_stack_00000190) [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000198;
  char (*in_stack_000001a0) [3];
  char **in_stack_000001a8;
  string local_50 [34];
  undefined1 local_2e;
  undefined1 local_2d;
  char *local_20;
  long local_18;
  
  local_18 = in_RDX;
  Exception::Exception((Exception *)0x1dcd71);
  local_20 = String::GetCStr(*(String **)(local_18 + 8));
  local_2d = 0x3a;
  local_2e = 0x3a;
  GetTokenStr_abi_cxx11_(in_stack_00000148);
  Exception::
  SetWhat<char_const*,char,int_const&,char,int_const&,char_const(&)[3],std::__cxx11::string,char_const(&)[3],char_const*&>
            (in_stack_00000168,in_stack_00000160,in_stack_00000158,in_stack_00000150,
             (char *)in_stack_00000148,in_stack_00000140,in_stack_00000190,in_stack_00000198,
             in_stack_000001a0,in_stack_000001a8);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

ParseException(const char *str, const TokenDetail &t)
        {
            SetWhat(t.module_->GetCStr(), ':', t.line_, ':', t.column_, " '",
                    GetTokenStr(t), "' ", str);
        }